

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O3

FxExpression * ParseRandomPick(FScanner *sc,FName identifier,PClassActor *cls)

{
  bool bVar1;
  FRandom *r;
  FxExpression *pFVar2;
  FxRandomPick *this;
  TArray<FxExpression_*,_FxExpression_*> list;
  TArray<FxExpression_*,_FxExpression_*> local_58;
  FScriptPosition local_40;
  
  local_58.Array = (FxExpression **)0x0;
  local_58.Most = 0;
  local_58.Count = 0;
  r = ParseRNG(sc);
  FScanner::MustGetToken(sc,0x28);
  while( true ) {
    pFVar2 = ParseExpressionM(sc,cls);
    TArray<FxExpression_*,_FxExpression_*>::Grow(&local_58,1);
    local_58.Array[local_58.Count] = pFVar2;
    local_58.Count = local_58.Count + 1;
    bVar1 = FScanner::CheckToken(sc,0x29);
    if (bVar1) break;
    FScanner::MustGetToken(sc,0x2c);
  }
  this = (FxRandomPick *)operator_new(0x50);
  FScriptPosition::FScriptPosition(&local_40,sc);
  FxRandomPick::FxRandomPick(this,r,&local_58,identifier.Index == 0xd0,&local_40);
  FString::~FString(&local_40.FileName);
  TArray<FxExpression_*,_FxExpression_*>::~TArray(&local_58);
  return &this->super_FxExpression;
}

Assistant:

static FxExpression *ParseRandomPick(FScanner &sc, FName identifier, PClassActor *cls)
{
	bool floaty = identifier == NAME_FRandomPick;
	FRandom *rng;
	TArray<FxExpression*> list;
	list.Clear();
	int index = 0;

	rng = ParseRNG(sc);
	sc.MustGetToken('(');

	for (;;)
	{
		FxExpression *expr = ParseExpressionM(sc, cls);
		list.Push(expr);
		if (sc.CheckToken(')'))
			break;
		sc.MustGetToken(',');
	}
	return new FxRandomPick(rng, list, floaty, sc);
}